

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::sampleTextureLayer
          (LayeredRenderCase *this,Surface *dst,int layer)

{
  ostringstream *this_00;
  code *pcVar1;
  RenderContext *context;
  int iVar2;
  undefined4 uVar3;
  deUint32 dVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  Buffer buf;
  VertexArray vao;
  undefined1 local_1b0 [384];
  long lVar6;
  
  if (Functional::(anonymous_namespace)::LayeredRenderCase::sampleTextureLayer(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::LayeredRenderCase::
                                 sampleTextureLayer(tcu::Surface&,int)::fullscreenQuad);
    if (iVar2 != 0) {
      sampleTextureLayer::fullscreenQuad[0].m_data[0] = _DAT_0167bb00;
      sampleTextureLayer::fullscreenQuad[0].m_data[1] = _UNK_0167bb04;
      sampleTextureLayer::fullscreenQuad[0].m_data[2] = _UNK_0167bb08;
      sampleTextureLayer::fullscreenQuad[0].m_data[3] = _UNK_0167bb0c;
      sampleTextureLayer::fullscreenQuad[1].m_data[0] = _DAT_0167baf0;
      sampleTextureLayer::fullscreenQuad[1].m_data[1] = _UNK_0167baf4;
      sampleTextureLayer::fullscreenQuad[1].m_data[2] = _UNK_0167baf8;
      sampleTextureLayer::fullscreenQuad[1].m_data[3] = _UNK_0167bafc;
      sampleTextureLayer::fullscreenQuad[2].m_data[0] = _DAT_0167bb20;
      sampleTextureLayer::fullscreenQuad[2].m_data[1] = _UNK_0167bb24;
      sampleTextureLayer::fullscreenQuad[2].m_data[2] = _UNK_0167bb28;
      sampleTextureLayer::fullscreenQuad[2].m_data[3] = _UNK_0167bb2c;
      sampleTextureLayer::fullscreenQuad[3].m_data[0] = _DAT_0167bb10;
      sampleTextureLayer::fullscreenQuad[3].m_data[1] = _UNK_0167bb14;
      sampleTextureLayer::fullscreenQuad[3].m_data[2] = _UNK_0167bb18;
      sampleTextureLayer::fullscreenQuad[3].m_data[3] = _UNK_0167bb1c;
      __cxa_guard_release(&Functional::(anonymous_namespace)::LayeredRenderCase::
                           sampleTextureLayer(tcu::Surface&,int)::fullscreenQuad);
    }
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(lVar6 + 0x780))((this->m_samplerShader->m_program).m_program,"a_position");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buf,((this->super_TestCase).m_context)->m_renderCtx);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Sampling from texture layer ");
  std::ostream::operator<<(this_00,layer);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4000);
  (**(code **)(lVar6 + 0x1a00))
            (0,0,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1]);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd4f);
  (**(code **)(lVar6 + 0x40))(0x8892,buf.super_ObjectWrapper.m_object);
  (**(code **)(lVar6 + 0x150))(0x8892,0x40,sampleTextureLayer::fullscreenQuad,0x88e4);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd53);
  (**(code **)(lVar6 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar6 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(uVar3);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd58);
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  GVar5 = getTargetTextureTarget(this->m_target);
  (*pcVar1)(GVar5,this->m_texture);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"bind texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd5c);
  (**(code **)(lVar6 + 0x1680))((this->m_samplerShader->m_program).m_program);
  (**(code **)(lVar6 + 0x14f0))(this->m_samplerLayerLoc,layer);
  (**(code **)(lVar6 + 0x14f0))(this->m_samplerSamplerLoc,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd61);
  (**(code **)(lVar6 + 0x538))(5,0,4);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd64);
  (**(code **)(lVar6 + 0x1680))(0);
  (**(code **)(lVar6 + 0xd8))(0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd68);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,dst);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  glu::ObjectWrapper::~ObjectWrapper(&buf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  return;
}

Assistant:

void LayeredRenderCase::sampleTextureLayer (tcu::Surface& dst, int layer)
{
	DE_ASSERT(dst.getWidth() == m_resolveDimensions.x());
	DE_ASSERT(dst.getHeight() == m_resolveDimensions.y());

	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				positionLoc	= gl.getAttribLocation(m_samplerShader->getProgram(), "a_position");
	glu::VertexArray		vao			(m_context.getRenderContext());
	glu::Buffer				buf			(m_context.getRenderContext());

	m_testCtx.getLog() << tcu::TestLog::Message << "Sampling from texture layer " << layer << tcu::TestLog::EndMessage;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.viewport(0, 0, m_resolveDimensions.x(), m_resolveDimensions.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindBuffer(GL_ARRAY_BUFFER, *buf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buf");

	gl.bindVertexArray(*vao);
	gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(positionLoc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(getTargetTextureTarget(m_target), m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	gl.useProgram(m_samplerShader->getProgram());
	gl.uniform1i(m_samplerLayerLoc, layer);
	gl.uniform1i(m_samplerSamplerLoc, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup program");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	gl.useProgram(0);
	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}